

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrowHandler.cpp
# Opt level: O2

ArrowOpt __thiscall yb::ArrowHandler::handle(ArrowHandler *this,uchar c)

{
  undefined8 uVar1;
  int iVar2;
  ArrowOpt AVar3;
  undefined4 uVar5;
  undefined7 in_register_00000031;
  long lVar6;
  long *plVar7;
  string local_58 [8];
  type ec;
  ArrowOpt AVar4;
  
  lVar6 = CONCAT71(in_register_00000031,c);
  ec.field_2._8_8_ = this;
  std::__cxx11::string::push_back(c + '@');
  plVar7 = (long *)(lVar6 + 0x18);
  while( true ) {
    plVar7 = (long *)*plVar7;
    if (plVar7 == (long *)0x0) {
      *(undefined8 *)(lVar6 + 0x48) = 0;
      **(undefined1 **)(lVar6 + 0x40) = 0;
      *(undefined8 *)ec.field_2._8_8_ = 0;
      AVar3.super__Optional_base<yb::Arrow,_false>.field_0 =
           (anon_union_4_2_e8b08be2_for__Optional_base<yb::Arrow,_false>_2)ec.field_2._8_4_;
      AVar3.super__Optional_base<yb::Arrow,_false>._M_engaged = (bool)ec.field_2._12_1_;
      AVar3.super__Optional_base<yb::Arrow,_false>._5_3_ = ec.field_2._13_3_;
      return (ArrowOpt)AVar3.super__Optional_base<yb::Arrow,_false>;
    }
    uVar5 = *(undefined4 *)(plVar7 + 1);
    std::__cxx11::string::string(local_58,(string *)(plVar7 + 2));
    iVar2 = std::__cxx11::string::compare((ulong)local_58,0,*(string **)(lVar6 + 0x48));
    uVar1 = ec.field_2._8_8_;
    if (iVar2 == 0) break;
    std::__cxx11::string::~string(local_58);
  }
  if (ec._M_dataplus._M_p == *(pointer *)(lVar6 + 0x48)) {
    *(undefined8 *)(lVar6 + 0x48) = 0;
    **(undefined1 **)(lVar6 + 0x40) = 0;
  }
  else {
    uVar5 = 4;
  }
  *(undefined4 *)ec.field_2._8_8_ = uVar5;
  *(undefined1 *)(ec.field_2._8_8_ + 4) = 1;
  std::__cxx11::string::~string(local_58);
  ec.field_2._8_4_ = (undefined4)uVar1;
  ec.field_2._12_1_ = SUB81(uVar1,4);
  ec.field_2._13_3_ = SUB83(uVar1,5);
  AVar4.super__Optional_base<yb::Arrow,_false>.field_0 =
       (anon_union_4_2_e8b08be2_for__Optional_base<yb::Arrow,_false>_2)ec.field_2._8_4_;
  AVar4.super__Optional_base<yb::Arrow,_false>._M_engaged = (bool)ec.field_2._12_1_;
  AVar4.super__Optional_base<yb::Arrow,_false>._5_3_ = ec.field_2._13_3_;
  return (ArrowOpt)AVar4.super__Optional_base<yb::Arrow,_false>;
}

Assistant:

ArrowHandler::ArrowOpt ArrowHandler::handle(unsigned char c) {
    currentState_ += c;
    for (auto it = escapeCodes_.begin(); it != escapeCodes_.end(); ++it) {
        auto arrow = std::get<0>(*it);
        auto ec = std::get<1>(*it);
        if (ec.compare(0, currentState_.length(), currentState_) == 0) {
            if (ec.length() == currentState_.length()) {
                currentState_.clear();
                return arrow;
            }
            return Arrow::invalid;
        }
    }
    currentState_.clear();
    return {};
}